

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_rfc6979_hmac_sha256_initialize
               (secp256k1_rfc6979_hmac_sha256 *rng,uchar *key,size_t keylen)

{
  undefined1 local_f0 [8];
  secp256k1_hmac_sha256 hmac;
  size_t keylen_local;
  uchar *key_local;
  secp256k1_rfc6979_hmac_sha256 *rng_local;
  
  hmac.outer.bytes = keylen;
  memset(rng,1,0x20);
  memset(rng->k,0,0x20);
  secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)local_f0,rng->k,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,rng->v,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,"",1);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,key,hmac.outer.bytes);
  secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)local_f0,rng->k);
  secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)local_f0,rng->k,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,rng->v,0x20);
  secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)local_f0,rng->v);
  secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)local_f0,rng->k,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,rng->v,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,"\x01",1);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,key,hmac.outer.bytes);
  secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)local_f0,rng->k);
  secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)local_f0,rng->k,0x20);
  secp256k1_hmac_sha256_write((secp256k1_hmac_sha256 *)local_f0,rng->v,0x20);
  secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)local_f0,rng->v);
  rng->retry = 0;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_initialize(secp256k1_rfc6979_hmac_sha256 *rng, const unsigned char *key, size_t keylen) {
    secp256k1_hmac_sha256 hmac;
    static const unsigned char zero[1] = {0x00};
    static const unsigned char one[1] = {0x01};

    memset(rng->v, 0x01, 32); /* RFC6979 3.2.b. */
    memset(rng->k, 0x00, 32); /* RFC6979 3.2.c. */

    /* RFC6979 3.2.d. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, zero, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);

    /* RFC6979 3.2.f. */
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_write(&hmac, one, 1);
    secp256k1_hmac_sha256_write(&hmac, key, keylen);
    secp256k1_hmac_sha256_finalize(&hmac, rng->k);
    secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
    secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
    secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    rng->retry = 0;
}